

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007220c0 == '\x01') {
    DAT_007220c0 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_007220e8 == '\x01') {
    DAT_007220e8 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_00722110 == '\x01') {
    DAT_00722110 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_00722148 == '\x01') {
    DAT_00722148 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_007221e0 == '\x01') {
    DAT_007221e0 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_00722260 == '\x01') {
    DAT_00722260 = '\0';
    (*(code *)*__ModelDescription_default_instance_)();
  }
  if (DAT_00722290 == '\x01') {
    DAT_00722290 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_007222c8 == '\x01') {
    DAT_007222c8 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}